

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapDevice.cpp
# Opt level: O0

void __thiscall
TRM::BitmapDevice::Line(BitmapDevice *this,int32_t x0,int32_t y0,int32_t x1,int32_t y1,Color *color)

{
  uint8_t r;
  uint8_t g;
  bool bVar1;
  uint32_t y;
  uint32_t uVar2;
  uint32_t y_00;
  element_type *peVar3;
  reference pvVar4;
  double extraout_XMM0_Qa;
  int32_t s_y_1;
  int32_t s_x_1;
  double dStack_88;
  array<unsigned_char,_4UL> rgba;
  double alpha;
  int32_t i_y;
  int32_t i_x;
  int32_t s_y;
  int32_t s_x;
  uint32_t len;
  line_bresenham_interpolator li;
  int32_t s_y1;
  int32_t s_x1;
  int32_t s_y0;
  int32_t s_x0;
  Color *color_local;
  int32_t y1_local;
  int32_t x1_local;
  int32_t y0_local;
  int32_t x0_local;
  BitmapDevice *this_local;
  
  li.m_interpolator.m_y = x1 << 8;
  li.m_interpolator.m_mod = y1 << 8;
  line_bresenham_interpolator::line_bresenham_interpolator
            ((line_bresenham_interpolator *)&s_x,x0 << 8,y0 << 8,li.m_interpolator.m_y,
             li.m_interpolator.m_mod);
  s_y = line_bresenham_interpolator::len((line_bresenham_interpolator *)&s_x);
  if (s_y == 0) {
    peVar3 = std::__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mBitmap);
    Bitmap::SetPixel(peVar3,x0,y0,color);
  }
  else {
    bVar1 = line_bresenham_interpolator::is_ver((line_bresenham_interpolator *)&s_x);
    if (bVar1) {
      do {
        uVar2 = line_bresenham_interpolator::x2((line_bresenham_interpolator *)&s_x);
        line_bresenham_interpolator::y1((line_bresenham_interpolator *)&s_x,extraout_XMM0_Qa);
        line_bresenham_interpolator::x2_hr((line_bresenham_interpolator *)&s_x);
        line_bresenham_interpolator::y2_hr((line_bresenham_interpolator *)&s_x);
        dStack_88 = 255.0;
        s_x_1 = (int32_t)Color::rgba(color);
        peVar3 = std::__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mBitmap);
        pvVar4 = std::array<unsigned_char,_4UL>::operator[]((array<unsigned_char,_4UL> *)&s_x_1,0);
        r = *pvVar4;
        pvVar4 = std::array<unsigned_char,_4UL>::operator[]((array<unsigned_char,_4UL> *)&s_x_1,1);
        g = *pvVar4;
        pvVar4 = std::array<unsigned_char,_4UL>::operator[]((array<unsigned_char,_4UL> *)&s_x_1,2);
        Color::Color((Color *)&s_y_1,r,g,*pvVar4,(uint8_t)(int)dStack_88);
        Bitmap::SetPixel(peVar3,uVar2,y,(Color *)&s_y_1);
        line_bresenham_interpolator::v_step((line_bresenham_interpolator *)&s_x);
        s_y = s_y + -1;
      } while (s_y != 0);
    }
    else {
      do {
        uVar2 = line_bresenham_interpolator::x1((line_bresenham_interpolator *)&s_x);
        y_00 = line_bresenham_interpolator::y2((line_bresenham_interpolator *)&s_x);
        peVar3 = std::__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mBitmap);
        Bitmap::SetPixel(peVar3,uVar2,y_00,color);
        line_bresenham_interpolator::h_step((line_bresenham_interpolator *)&s_x);
        s_y = s_y + -1;
      } while (s_y != 0);
    }
  }
  return;
}

Assistant:

void BitmapDevice::Line(int32_t x0, int32_t y0, int32_t x1, int32_t y1,
                        Color const& color) {
  int32_t s_x0 = x0 * line_bresenham_interpolator::subpixel_scale;
  int32_t s_y0 = y0 * line_bresenham_interpolator::subpixel_scale;
  int32_t s_x1 = x1 * line_bresenham_interpolator::subpixel_scale;
  int32_t s_y1 = y1 * line_bresenham_interpolator::subpixel_scale;

  line_bresenham_interpolator li{s_x0, s_y0, s_x1, s_y1};

  uint32_t len = li.len();

  if (len == 0) {
    mBitmap->SetPixel(x0, y0, color);
    return;
  }

  if (li.is_ver()) {
    do {
      int32_t s_x = li.x2();
      int32_t s_y = li.y1();

      int32_t i_x = li.x2_hr() % li.subpixel_mask;
      int32_t i_y = li.y2_hr() % li.subpixel_mask;

      double alpha = 255;

      auto rgba = color.rgba();
      mBitmap->SetPixel(s_x, s_y, Color(rgba[0], rgba[1], rgba[2], (uint8_t) alpha));

      li.v_step();
    } while (--len);
  } else {
    do {
      int32_t s_x = li.x1();
      int32_t s_y = li.y2();

      mBitmap->SetPixel(s_x, s_y, color);

      li.h_step();
    } while (--len);
  }
}